

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

int __thiscall common::Config::Init(Config *this,string *config_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  char cVar4;
  int iVar5;
  istream *piVar6;
  long lVar7;
  Log *pLVar8;
  shared_ptr<common::Host> host;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string local_2e0;
  Config *local_2c0;
  string group;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string local_278;
  string s;
  ifstream infile;
  
  std::ifstream::ifstream((istream *)&infile,(config_file->_M_dataplus)._M_p,_S_in);
  group._M_dataplus._M_p = (pointer)&group.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&group,anon_var_dwarf_f4 + 0xc);
  local_2c0 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_group_names,&group);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_2e0.field_2;
  do {
    while( true ) {
      do {
        do {
          cVar4 = std::ios::widen((char)*(undefined8 *)(_infile + -0x18) + (char)(istream *)&infile)
          ;
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&infile,(string *)&s,cVar4);
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
            pLVar8 = xlib::Log::Instance();
            local_2e0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2e0,"read host num %v ","");
            vec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((long)(local_2c0->m_hosts).
                                 super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_2c0->m_hosts).
                                 super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
            xlib::Log::SWrite<unsigned_long>
                      (pLVar8,LOG_PRIORITY_DEBUG,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                       ,0x38,"Init",true,&local_2e0,(unsigned_long *)&vec);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != paVar1) {
              operator_delete(local_2e0._M_dataplus._M_p);
            }
            std::ifstream::close();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)s._M_dataplus._M_p != &s.field_2) {
              operator_delete(s._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)group._M_dataplus._M_p != &group.field_2) {
              operator_delete(group._M_dataplus._M_p);
            }
            std::ifstream::~ifstream(&infile);
            return 0;
          }
          xlib::Trim(&s);
        } while (s._M_string_length == 0);
        cVar4 = (char)&s;
        lVar7 = std::__cxx11::string::find(cVar4,0x23);
      } while (lVar7 == 0);
      if (2 < s._M_string_length) break;
LAB_0010e05f:
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0," ","");
      xlib::Split(&s,&local_2e0,&vec);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if ((ulong)((long)vec.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x81) {
        pLVar8 = xlib::Log::Instance();
        local_2e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"ignore %v","");
        xlib::Log::SWrite<std::__cxx11::string>
                  (pLVar8,LOG_PRIORITY_DEBUG,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                   ,0x35,"Init",true,&local_2e0,&s);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
      }
      else {
        host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(0xc0);
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alias).
        _M_dataplus._M_p =
             (pointer)&((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       alias).field_2;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alias).
        _M_string_length = 0;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alias).field_2.
        _M_local_buf[0] = '\0';
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->user).
        _M_dataplus._M_p =
             (pointer)&((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       user).field_2;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->user).
        _M_string_length = 0;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->user).field_2.
        _M_local_buf[0] = '\0';
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->password).
        _M_dataplus._M_p =
             (pointer)&((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       password).field_2;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->password).
        _M_string_length = 0;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->password).
        field_2._M_local_buf[0] = '\0';
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ip)._M_dataplus
        ._M_p = (pointer)&((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->ip).field_2;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ip).
        _M_string_length = 0;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ip).field_2.
        _M_local_buf[0] = '\0';
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->group).
        _M_dataplus._M_p =
             (pointer)&((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       group).field_2;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->group).
        _M_string_length = 0;
        ((host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->group).field_2.
        _M_local_buf[0] = '\0';
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<common::Host*>
                  (&host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::_M_assign
                  ((string *)
                   host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ip);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->user
                  );
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    password);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        pcVar2 = vec.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,pcVar2,
                   pcVar2 + vec.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
        iVar5 = xlib::Stoi(&local_278);
        (host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->port =
             (uint16_t)iVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        pbVar3 = vec.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tags.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        tags.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tags.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0xa0 < (ulong)((long)vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vec.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          local_2e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"|","");
          xlib::Split(pbVar3 + 5,&local_2e0,&tags);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2e0._M_dataplus._M_p);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     tags,&tags);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    group);
        std::vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
        ::push_back(&local_2c0->m_hosts,&host);
        pLVar8 = xlib::Log::Instance();
        local_2e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,"add host %v in group %v","");
        xlib::Log::SWrite<std::__cxx11::string,std::__cxx11::string>
                  (pLVar8,LOG_PRIORITY_DEBUG,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                   ,0x33,"Init",true,&local_2e0,
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    alias,&group);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tags);
        if (host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vec);
    }
    lVar7 = std::__cxx11::string::find(cVar4,0x5b);
    if (lVar7 != 0) goto LAB_0010e05f;
    lVar7 = std::__cxx11::string::find(cVar4,0x5d);
    if (lVar7 == 0) goto LAB_0010e05f;
    std::__cxx11::string::find(cVar4,0x5b);
    std::__cxx11::string::find(cVar4,0x5d);
    std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&s);
    std::__cxx11::string::operator=((string *)&group,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_group_names,&group);
    pLVar8 = xlib::Log::Instance();
    local_2e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"set group %v","");
    xlib::Log::SWrite<std::__cxx11::string>
              (pLVar8,LOG_PRIORITY_DEBUG,
               "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
               ,0x1f,"Init",true,&local_2e0,&group);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

int Config::Init(const std::string& config_file) {
    std::ifstream infile(config_file.data());

    std::string group("");
    m_group_names.push_back(group);
    std::string s;
    while (getline(infile, s)) {
        xlib::Trim(s);
        if (s.size() == 0 || s.find('#') == 0) {
            continue;
        }

        if (s.size() > 2 && s.find('[') == 0 && s.find(']') > 0) {
            group = s.substr(s.find('[')+1, s.find(']')-1);
            m_group_names.push_back(group);
            XDBG("set group %v", group);
            continue;
        }
        std::vector<std::string> vec;
        xlib::Split(s, " ",  &vec);
        if (vec.size() >= 5) {
            cxx::shared_ptr<Host> host(new Host);
            host->alias = vec[0];
            host->ip    = vec[1];
            host->user  = vec[2];
            host->password = vec[3];
            host->port     = static_cast<uint32_t>(xlib::Stoi(vec[4]));

            std::vector<std::string> tags;
            if (vec.size() >= 6) {
                xlib::Split(vec[5], "|", &tags);
            }
            host->tags = tags;
            host->group = group;
            m_hosts.push_back(host);
            XDBG("add host %v in group %v", host->alias, group);
        } else {
            XDBG("ignore %v", s);
        }
    }
    XDBG("read host num %v ", m_hosts.size());
    infile.close();
    return 0;
}